

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::Transaction::GetTxOutIndex(Transaction *this,Script *locking_script)

{
  pointer pTVar1;
  __type _Var2;
  CfdException *this_00;
  long lVar3;
  ulong uVar4;
  string search_str;
  Script local_88;
  string script;
  
  Script::GetHex_abi_cxx11_(&search_str,locking_script);
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    pTVar1 = (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((((long)(this->vout_).
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar1) / 0x50 & 0xffffffffU) <= uVar4) {
      local_88._vptr_Script = (_func_int **)0x4b0ffe;
      local_88.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x20e;
      local_88.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = "GetTxOutIndex";
      logger::warn<>((CfdSourceLocation *)&local_88,"locking script is not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&local_88,"locking script is not found.",(allocator *)&script);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_88);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    AbstractTxOut::GetLockingScript
              (&local_88,
               (AbstractTxOut *)((long)&(pTVar1->super_AbstractTxOut)._vptr_AbstractTxOut + lVar3));
    Script::GetHex_abi_cxx11_(&script,&local_88);
    Script::~Script(&local_88);
    _Var2 = ::std::operator==(&script,&search_str);
    ::std::__cxx11::string::~string((string *)&script);
    if (_Var2) break;
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x50;
  }
  ::std::__cxx11::string::~string((string *)&search_str);
  return (uint32_t)uVar4;
}

Assistant:

uint32_t Transaction::GetTxOutIndex(const Script &locking_script) const {
  std::string search_str = locking_script.GetHex();
  uint32_t index = 0;
  for (; index < static_cast<uint32_t>(vout_.size()); ++index) {
    std::string script = vout_[index].GetLockingScript().GetHex();
    if (script == search_str) {
      return index;
    }
  }
  warn(CFD_LOG_SOURCE, "locking script is not found.");
  throw CfdException(kCfdIllegalArgumentError, "locking script is not found.");
}